

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldGenerator::GenerateBuildingCode
          (ImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  char *text;
  
  bVar1 = HasHazzer(this->descriptor_);
  if (bVar1) {
    bVar1 = IsDefaultValueJavaDefault(this->descriptor_);
    if (bVar1) {
      text = 
      "if ($get_has_field_bit_from_local$) {\n  result.$name$_ = $name$_;\n  $set_has_field_bit_to_local$;\n}\n"
      ;
    }
    else {
      text = 
      "if ($get_has_field_bit_from_local$) {\n  $set_has_field_bit_to_local$;\n}\nresult.$name$_ = $name$_;\n"
      ;
    }
  }
  else {
    text = "result.$name$_ = $name$_;\n";
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutablePrimitiveFieldGenerator::GenerateBuildingCode(
    io::Printer* printer) const {
  if (HasHazzer(descriptor_)) {
    if (IsDefaultValueJavaDefault(descriptor_)) {
      printer->Print(variables_,
                     "if ($get_has_field_bit_from_local$) {\n"
                     "  result.$name$_ = $name$_;\n"
                     "  $set_has_field_bit_to_local$;\n"
                     "}\n");
    } else {
      printer->Print(variables_,
                     "if ($get_has_field_bit_from_local$) {\n"
                     "  $set_has_field_bit_to_local$;\n"
                     "}\n"
                     "result.$name$_ = $name$_;\n");
    }
  } else {
    printer->Print(variables_, "result.$name$_ = $name$_;\n");
  }
}